

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

int Abc_NtkCompareAndSaveBest(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    iVar1 = 0;
    if (Abc_NtkCompareAndSaveBest_ParsBest_0 != (char *)0x0) {
      free(Abc_NtkCompareAndSaveBest_ParsBest_0);
      Abc_NtkCompareAndSaveBest_ParsBest_0 = (char *)0x0;
    }
  }
  else {
    iVar1 = 0;
    if (pNtk->ntkType == ABC_NTK_LOGIC) {
      Abc_NtkCompareAndSaveBest_ParsNew_0 = Abc_NtkLevel(pNtk);
      Abc_NtkCompareAndSaveBest_ParsNew_1 = pNtk->nObjCounts[8];
      iVar1 = Abc_NtkGetTotalFanins(pNtk);
      pcVar4 = Abc_NtkCompareAndSaveBest_ParsBest_0;
      Abc_NtkCompareAndSaveBest_ParsNew_3 = iVar1;
      if (Abc_NtkCompareAndSaveBest_ParsBest_0 != (char *)0x0) {
        iVar2 = strcmp(Abc_NtkCompareAndSaveBest_ParsBest_0,pNtk->pName);
        if ((iVar2 == 0) &&
           (Abc_NtkCompareAndSaveBest_ParsBest_1 <= Abc_NtkCompareAndSaveBest_ParsNew_0)) {
          if (Abc_NtkCompareAndSaveBest_ParsBest_1 != Abc_NtkCompareAndSaveBest_ParsNew_0) {
            return 0;
          }
          if (Abc_NtkCompareAndSaveBest_ParsBest_2 <= Abc_NtkCompareAndSaveBest_ParsNew_1) {
            if (Abc_NtkCompareAndSaveBest_ParsBest_2 != Abc_NtkCompareAndSaveBest_ParsNew_1) {
              return 0;
            }
            if (Abc_NtkCompareAndSaveBest_ParsBest_4 <= iVar1) {
              return 0;
            }
          }
        }
        free(pcVar4);
        Abc_NtkCompareAndSaveBest_ParsBest_0 = (char *)0x0;
      }
      Abc_NtkCompareAndSaveBest_ParsBest_0 = Extra_UtilStrsav(pNtk->pName);
      Abc_NtkCompareAndSaveBest_ParsBest_1 = Abc_NtkCompareAndSaveBest_ParsNew_0;
      Abc_NtkCompareAndSaveBest_ParsBest_2 = Abc_NtkCompareAndSaveBest_ParsNew_1;
      Abc_NtkCompareAndSaveBest_ParsBest_4 = Abc_NtkCompareAndSaveBest_ParsNew_3;
      pcVar4 = pNtk->pSpec;
      sVar3 = strlen(pcVar4);
      iVar1 = strcmp(pcVar4 + (sVar3 - 10),"_best.blif");
      if (iVar1 != 0) {
        pcVar4 = Extra_FileNameGenericAppend(pcVar4,"_best.blif");
      }
      Io_Write(pNtk,pcVar4,IO_FILE_BLIF);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int Abc_NtkCompareAndSaveBest( Abc_Ntk_t * pNtk )
{
    extern void Io_Write( Abc_Ntk_t * pNtk, char * pFileName, Io_FileType_t FileType );
    static struct ParStruct {
        char * pName;  // name of the best saved network
        int    Depth;  // depth of the best saved network
        int    Flops;  // flops in the best saved network 
        int    Nodes;  // nodes in the best saved network
        int    Edges;  // edges in the best saved network
        int    nPis;   // the number of primary inputs
        int    nPos;   // the number of primary outputs
    } ParsNew, ParsBest = { 0 };
    char * pFileNameOut;
    // free storage for the name
    if ( pNtk == NULL )
    {
        ABC_FREE( ParsBest.pName );
        return 0;
    }
    // quit if not a logic network
    if ( !Abc_NtkIsLogic(pNtk) )
        return 0;
    // get the parameters
    ParsNew.Depth = Abc_NtkLevel( pNtk );
    ParsNew.Flops = Abc_NtkLatchNum( pNtk );
    ParsNew.Nodes = Abc_NtkNodeNum( pNtk );
    ParsNew.Edges = Abc_NtkGetTotalFanins( pNtk );
    ParsNew.nPis  = Abc_NtkPiNum( pNtk );
    ParsNew.nPos  = Abc_NtkPoNum( pNtk );
    // reset the parameters if the network has the same name
    if (  ParsBest.pName == NULL ||
          strcmp(ParsBest.pName, pNtk->pName) ||
          ParsBest.Depth >  ParsNew.Depth ||
         (ParsBest.Depth == ParsNew.Depth && ParsBest.Flops >  ParsNew.Flops) ||
         (ParsBest.Depth == ParsNew.Depth && ParsBest.Flops == ParsNew.Flops && ParsBest.Edges >  ParsNew.Edges) )
    {
        ABC_FREE( ParsBest.pName );
        ParsBest.pName = Extra_UtilStrsav( pNtk->pName );
        ParsBest.Depth = ParsNew.Depth;
        ParsBest.Flops = ParsNew.Flops;
        ParsBest.Nodes = ParsNew.Nodes;
        ParsBest.Edges = ParsNew.Edges;
        ParsBest.nPis  = ParsNew.nPis;
        ParsBest.nPos  = ParsNew.nPos;
        // writ the network
        if ( strcmp(pNtk->pSpec + strlen(pNtk->pSpec) - strlen("_best.blif"), "_best.blif") )
            pFileNameOut = Extra_FileNameGenericAppend( pNtk->pSpec, "_best.blif" );
        else
            pFileNameOut = pNtk->pSpec;
        Io_Write( pNtk, pFileNameOut, IO_FILE_BLIF );
        return 1;
    }
    return 0;
}